

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PointRenderCase::init
          (PointRenderCase *this,EVP_PKEY_CTX *ctx)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this_00;
  undefined8 *puVar1;
  pointer *this_01;
  uint uVar2;
  int iVar3;
  pointer pVVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  ulong uVar9;
  ulong uVar10;
  NotSupportedError *pNVar11;
  ulong uVar12;
  int iVar13;
  char *pcVar14;
  EVP_PKEY_CTX *ctx_00;
  int ndx;
  long lVar15;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  allocator<char> local_1a9;
  GLfloat pointSizeRange [2];
  vector<int,_std::allocator<int>_> cellOrder;
  undefined8 uVar16;
  
  if (this->m_isWidePointCase == true) {
    if ((this->super_BBoxRenderCase).m_hasGeometryStage == true) {
      bVar6 = glu::ContextInfo::isExtensionSupported
                        (((this->super_BBoxRenderCase).super_TestCase.m_context)->m_contextInfo,
                         "GL_EXT_geometry_point_size");
      if (!bVar6) {
        pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cellOrder,"Test requires GL_EXT_geometry_point_size extension",
                   (allocator<char> *)pointSizeRange);
        tcu::NotSupportedError::NotSupportedError(pNVar11,(string *)&cellOrder);
        __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
    if (((this->super_BBoxRenderCase).m_hasTessellationStage == true) &&
       ((this->super_BBoxRenderCase).m_hasGeometryStage == false)) {
      bVar6 = glu::ContextInfo::isExtensionSupported
                        (((this->super_BBoxRenderCase).super_TestCase.m_context)->m_contextInfo,
                         "GL_EXT_tessellation_point_size");
      if (!bVar6) {
        pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cellOrder,"Test requires GL_EXT_tessellation_point_size extension",
                   (allocator<char> *)pointSizeRange);
        tcu::NotSupportedError::NotSupportedError(pNVar11,(string *)&cellOrder);
        __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
    pointSizeRange[0] = 0.0;
    pointSizeRange[1] = 0.0;
    iVar7 = (*((this->super_BBoxRenderCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar7) + 0x818))(0x846d,pointSizeRange);
    if (pointSizeRange[1] < 5.0) {
      pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cellOrder,"Test requires point size 5.0",&local_1a9);
      tcu::NotSupportedError::NotSupportedError(pNVar11,(string *)&cellOrder);
      __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                )->m_log;
  this_01 = &cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
  std::operator<<((ostream *)this_01,"Rendering point pattern to ");
  pcVar14 = "fbo";
  if ((this->super_BBoxRenderCase).m_renderTarget == RENDERTARGET_DEFAULT) {
    pcVar14 = "default frame buffer";
  }
  std::operator<<((ostream *)this_01,pcVar14);
  std::operator<<((ostream *)this_01,".\n");
  std::operator<<((ostream *)this_01,
                  "Half of the points are green, half blue. Using additive blending.\n");
  std::operator<<((ostream *)this_01,
                  "Points are in random order, varying pattern size and location for each iteration.\n"
                 );
  std::operator<<((ostream *)this_01,
                  "Marking all discardable fragments (fragments outside the bounding box) with a fully saturated red channel."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&cellOrder,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
  iVar7 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
  std::vector<int,_std::allocator<int>_>::vector
            (&cellOrder,(long)(iVar7 * iVar7 * 2),(allocator_type *)pointSizeRange);
  deRandom_init((deRandom *)pointSizeRange,0xde22446);
  uVar9 = (ulong)((long)cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar12 = 0;
  uVar10 = uVar9 & 0xffffffff;
  if ((int)uVar9 < 1) {
    uVar10 = uVar12;
  }
  for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar12] = (int)uVar12;
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)pointSizeRange,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  this_00 = &this->m_attribData;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (this_00,(long)cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 1);
  iVar7 = 1;
  ctx_00 = (EVP_PKEY_CTX *)0x0;
  for (lVar15 = 0;
      lVar15 < (int)((ulong)((long)cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2); lVar15 = lVar15 + 1) {
    uVar2 = cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar15];
    iVar3 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
    lVar5 = CONCAT44((int)uVar2 >> 0x1f,(int)uVar2 >> 1);
    iVar13 = (int)(lVar5 % (long)iVar3);
    iVar8 = (int)(lVar5 / (long)iVar3);
    if ((uVar2 & 1) == 0) {
      auVar20._0_4_ = (float)iVar3;
      auVar17._0_4_ = (float)iVar8 + 0.5;
      auVar17._4_4_ = (float)iVar13 + 0.5;
      auVar17._8_8_ = 0;
      auVar20._4_4_ = auVar20._0_4_;
      auVar20._8_4_ = auVar20._0_4_;
      auVar20._12_4_ = auVar20._0_4_;
      auVar18 = divps(auVar17,auVar20);
      uVar16 = auVar18._0_8_;
      uVar19 = 0x3f80000000000000;
    }
    else {
      auVar21._0_4_ = (float)iVar3;
      auVar18._0_4_ = (float)iVar13;
      auVar18._4_4_ = (float)iVar8;
      auVar18._8_8_ = 0;
      auVar21._4_4_ = auVar21._0_4_;
      auVar21._8_4_ = auVar21._0_4_;
      auVar21._12_4_ = auVar21._0_4_;
      auVar18 = divps(auVar18,auVar21);
      uVar16 = auVar18._0_8_;
      uVar19 = 0x3f800000;
    }
    puVar1 = (undefined8 *)
             ((long)((this_00->
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->m_data + ((long)ctx_00 >> 0x1c));
    *puVar1 = uVar16;
    puVar1[1] = 0x3f80000000000000;
    pVVar4 = (this_00->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar4[iVar7].m_data[0] = 0.0;
    *(undefined8 *)(pVVar4[iVar7].m_data + 1) = uVar19;
    pVVar4[iVar7].m_data[3] = 1.0;
    iVar7 = iVar7 + 2;
    ctx_00 = ctx_00 + 0x200000000;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&cellOrder.super__Vector_base<int,_std::allocator<int>_>);
  iVar7 = BBoxRenderCase::init(&this->super_BBoxRenderCase,ctx_00);
  return iVar7;
}

Assistant:

void PointRenderCase::init (void)
{
	if (m_isWidePointCase)
	{
		// extensions
		if (m_hasGeometryStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_point_size"))
			throw tcu::NotSupportedError("Test requires GL_EXT_geometry_point_size extension");
		if (m_hasTessellationStage && !m_hasGeometryStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_point_size"))
			throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_point_size extension");

		// point size range
		{
			glw::GLfloat pointSizeRange[2] = {0.0f, 0.0f};
			m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_POINT_SIZE_RANGE, pointSizeRange);

			if (pointSizeRange[1] < 5.0f)
				throw tcu::NotSupportedError("Test requires point size 5.0");
		}
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering point pattern to " << ((m_renderTarget == RENDERTARGET_DEFAULT) ? ("default frame buffer") : ("fbo")) << ".\n"
		<< "Half of the points are green, half blue. Using additive blending.\n"
		<< "Points are in random order, varying pattern size and location for each iteration.\n"
		<< "Marking all discardable fragments (fragments outside the bounding box) with a fully saturated red channel."
		<< tcu::TestLog::EndMessage;

	generateAttributeData();

	BBoxRenderCase::init();
}